

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O0

real __thiscall
fasttext::ProductQuantizer::mulcode
          (ProductQuantizer *this,Vector *x,uint8_t *codes,int32_t t,real alpha)

{
  real *prVar1;
  real *prVar2;
  Vector *in_RDI;
  float in_XMM0_Da;
  int n;
  real *c;
  int m;
  uint8_t *code;
  int32_t d;
  real res;
  int64_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int local_34;
  int local_28;
  float local_24;
  
  local_24 = 0.0;
  local_28 = *(int *)((long)&in_RDI[2].data_.mem_ + 4);
  for (local_34 = 0; local_34 < *(int *)&in_RDI[2].data_.mem_; local_34 = local_34 + 1) {
    prVar1 = get_centroids((ProductQuantizer *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           (int32_t)((ulong)in_RDI >> 0x20),(uint8_t)((ulong)in_RDI >> 0x18));
    if (local_34 == *(int *)&in_RDI[2].data_.mem_ + -1) {
      local_28 = (int)in_RDI[2].data_.size_;
    }
    for (in_stack_ffffffffffffffbc = 0; in_stack_ffffffffffffffbc < local_28;
        in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 1) {
      prVar2 = Vector::operator[](in_RDI,in_stack_ffffffffffffffa8);
      local_24 = *prVar2 * prVar1[in_stack_ffffffffffffffbc] + local_24;
    }
  }
  return local_24 * in_XMM0_Da;
}

Assistant:

real ProductQuantizer::mulcode(
    const Vector& x,
    const uint8_t* codes,
    int32_t t,
    real alpha) const {
  real res = 0.0;
  auto d = dsub_;
  const uint8_t* code = codes + nsubq_ * t;
  for (auto m = 0; m < nsubq_; m++) {
    const real* c = get_centroids(m, code[m]);
    if (m == nsubq_ - 1) {
      d = lastdsub_;
    }
    for (auto n = 0; n < d; n++) {
      res += x[m * dsub_ + n] * c[n];
    }
  }
  return res * alpha;
}